

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* util::explode(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,string *delimiter,string *str)

{
  long lVar1;
  size_t sVar2;
  string *psVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_31;
  long local_30;
  size_t pos;
  size_t lastpos;
  string *str_local;
  string *delimiter_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pieces;
  
  pos = 0;
  local_30 = 0;
  local_31 = 0;
  lastpos = (size_t)str;
  str_local = delimiter;
  delimiter_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_30 = std::__cxx11::string::find((string *)lastpos,(ulong)str_local);
  while (local_30 != -1) {
    std::__cxx11::string::substr((ulong)&local_58,lastpos);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    lVar1 = local_30;
    lVar4 = std::__cxx11::string::length();
    psVar3 = str_local;
    sVar2 = lastpos;
    pos = lVar1 + lVar4;
    std::__cxx11::string::length();
    local_30 = std::__cxx11::string::find((string *)sVar2,(ulong)psVar3);
  }
  std::__cxx11::string::substr((ulong)&local_88,lastpos);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> explode(const std::string& delimiter, const std::string& str)
{
	std::size_t lastpos = 0;
	std::size_t pos = 0;
	std::vector<std::string> pieces;

	for (pos = str.find(delimiter); pos != std::string::npos; )
	{
		pieces.emplace_back(str.substr(lastpos, pos - lastpos));
		lastpos = pos + delimiter.length();
		pos = str.find(delimiter, pos + delimiter.length());
	}
	pieces.emplace_back(str.substr(lastpos));

	return pieces;
}